

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

int phr_parse_response(char *buf_start,size_t len,int *minor_version,int *status,char **msg,
                      size_t *msg_len,phr_header *headers,size_t *num_headers,size_t last_len)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  int local_3c;
  size_t local_38;
  
  pcVar8 = buf_start + len;
  local_38 = *num_headers;
  *minor_version = -1;
  *status = 0;
  iVar4 = 0;
  *msg = (char *)0x0;
  *msg_len = 0;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar3 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar3 = buf_start;
    }
    do {
      if (pcVar3 == pcVar8) {
        return -2;
      }
      pcVar7 = pcVar3 + 1;
      if (*pcVar3 == '\n') {
LAB_0010b909:
        iVar2 = iVar4 + 1;
      }
      else {
        iVar2 = 0;
        if (*pcVar3 == '\r') {
          if (pcVar7 == pcVar8) {
            return -2;
          }
          if (*pcVar7 != '\n') {
            return -1;
          }
          pcVar7 = pcVar3 + 2;
          goto LAB_0010b909;
        }
      }
      iVar4 = iVar2;
      pcVar3 = pcVar7;
    } while (iVar4 != 2);
  }
  pcVar3 = parse_http_version(buf_start,pcVar8,minor_version,&local_3c);
  if (pcVar3 == (char *)0x0) {
    return local_3c;
  }
  if (*pcVar3 == ' ') {
    lVar5 = (long)pcVar8 - (long)pcVar3;
    pcVar3 = pcVar3 + 1;
    do {
      pcVar7 = pcVar3;
      if (pcVar7 == pcVar8) {
        return -2;
      }
      cVar1 = *pcVar7;
      lVar5 = lVar5 + -1;
      pcVar3 = pcVar7 + 1;
    } while (cVar1 == ' ');
    if (lVar5 < 4) {
      return -2;
    }
    if (0xf5 < (byte)(cVar1 - 0x3aU)) {
      iVar4 = (uint)(byte)(cVar1 - 0x30) * 100;
      *status = iVar4;
      cVar1 = pcVar7[1];
      if (0xf5 < (byte)(cVar1 - 0x3aU)) {
        iVar4 = iVar4 + (uint)(byte)(cVar1 * '\n' + 0x20);
        *status = iVar4;
        if (0xf5 < (byte)(pcVar7[2] - 0x3aU)) {
          *status = iVar4 + (uint)(byte)(pcVar7[2] - 0x30);
          pcVar3 = get_token_to_eol(pcVar7 + 3,pcVar8,msg,msg_len,&local_3c);
          if (pcVar3 == (char *)0x0) {
            return local_3c;
          }
          sVar6 = *msg_len;
          if (sVar6 != 0) {
            pcVar7 = *msg;
            if (*pcVar7 != ' ') {
              return -1;
            }
            do {
              sVar6 = sVar6 - 1;
              pcVar7 = pcVar7 + 1;
              *msg = pcVar7;
              *msg_len = sVar6;
            } while (*pcVar7 == ' ');
          }
          pcVar8 = parse_headers(pcVar3,pcVar8,headers,num_headers,local_38,&local_3c);
          if (pcVar8 != (char *)0x0) {
            return (int)pcVar8 - (int)buf_start;
          }
          return local_3c;
        }
      }
    }
  }
  return -1;
}

Assistant:

int phr_parse_response(const char *buf_start, size_t len, int *minor_version, int *status, const char **msg, size_t *msg_len,
                       struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *minor_version = -1;
    *status = 0;
    *msg = NULL;
    *msg_len = 0;
    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}